

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<const_kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry_&> __thiscall
kj::
Table<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>>
::find<0ul,capnp::StructSchema&>
          (Table<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>>
           *this,StructSchema *params)

{
  HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks> *pHVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  Entry *t;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  ArrayPtr<const_kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> AVar3;
  unsigned_long *pos;
  Entry *local_50;
  StructSchema *local_48;
  Maybe<unsigned_long> local_40;
  undefined1 local_30 [8];
  NullableValue<unsigned_long> _pos597;
  StructSchema *params_local;
  Table<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
  *this_local;
  
  _pos597.field_1 = in_RDX;
  pHVar1 = get<0ul,kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>const&>
                     ((HashIndex<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Callbacks>
                       *)(params + 4));
  AVar3 = Vector<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry>::asPtr
                    ((Vector<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> *)
                     params);
  fwd<capnp::StructSchema&>((StructSchema *)_pos597.field_1);
  local_50 = AVar3.ptr;
  local_48 = (StructSchema *)AVar3.size_;
  AVar3.size_ = (size_t)local_50;
  AVar3.ptr = (Entry *)pHVar1;
  HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>::
  find<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry_const,capnp::StructSchema&>
            ((HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks> *)
             &local_40,AVar3,local_48);
  other = kj::_::readMaybe<unsigned_long>(&local_40);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other)
  ;
  Maybe<unsigned_long>::~Maybe(&local_40);
  puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 == (unsigned_long *)0x0) {
    Maybe<const_kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry_&>::Maybe
              ((Maybe<const_kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry_&> *)
               this);
  }
  else {
    puVar2 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_30);
    t = Vector<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry>::operator[]
                  ((Vector<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> *)
                   params,*puVar2);
    Maybe<const_kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry_&>::Maybe
              ((Maybe<const_kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry_&> *)
               this,t);
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return (Maybe<const_kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry_&>)
         (Entry *)this;
}

Assistant:

kj::Maybe<const Row&> Table<Row, Indexes...>::find(Params&&... params) const {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}